

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

void * xmlFileOpen_real(char *filename)

{
  int iVar1;
  FILE *fd;
  char *path;
  char *filename_local;
  
  if (filename == (char *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    iVar1 = strcmp(filename,"-");
    if (iVar1 == 0) {
      filename_local = _stdin;
    }
    else {
      iVar1 = xmlStrncasecmp((xmlChar *)filename,(xmlChar *)"file://localhost/",0x11);
      if (iVar1 == 0) {
        fd = (FILE *)(filename + 0x10);
      }
      else {
        iVar1 = xmlStrncasecmp((xmlChar *)filename,(xmlChar *)"file:///",8);
        if (iVar1 == 0) {
          fd = (FILE *)(filename + 7);
        }
        else {
          iVar1 = xmlStrncasecmp((xmlChar *)filename,(xmlChar *)"file:/",6);
          fd = (FILE *)filename;
          if (iVar1 == 0) {
            fd = (FILE *)(filename + 5);
          }
        }
      }
      iVar1 = xmlCheckFilename((char *)fd);
      if (iVar1 == 0) {
        filename_local = (char *)0x0;
      }
      else {
        filename_local = (char *)fopen64((char *)fd,"rb");
        if ((FILE *)filename_local == (FILE *)0x0) {
          xmlIOErr(0,(char *)fd);
        }
      }
    }
  }
  return filename_local;
}

Assistant:

static void *
xmlFileOpen_real (const char *filename) {
    const char *path = filename;
    FILE *fd;

    if (filename == NULL)
        return(NULL);

    if (!strcmp(filename, "-")) {
	fd = stdin;
	return((void *) fd);
    }

    if (!xmlStrncasecmp(BAD_CAST filename, BAD_CAST "file://localhost/", 17)) {
#if defined (_WIN32)
	path = &filename[17];
#else
	path = &filename[16];
#endif
    } else if (!xmlStrncasecmp(BAD_CAST filename, BAD_CAST "file:///", 8)) {
#if defined (_WIN32)
	path = &filename[8];
#else
	path = &filename[7];
#endif
    } else if (!xmlStrncasecmp(BAD_CAST filename, BAD_CAST "file:/", 6)) {
        /* lots of generators seems to lazy to read RFC 1738 */
#if defined (_WIN32)
	path = &filename[6];
#else
	path = &filename[5];
#endif
    }

    /* Do not check DDNAME on zOS ! */
#if !defined(__MVS__)
    if (!xmlCheckFilename(path))
        return(NULL);
#endif

#if defined(_WIN32)
    fd = xmlWrapOpenUtf8(path, 0);
#else
    fd = fopen(path, "rb");
#endif /* WIN32 */
    if (fd == NULL) xmlIOErr(0, path);
    return((void *) fd);
}